

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O0

Token * __thiscall
EOPlus::Parser_Token_Server<std::_Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*>_>
::xGetToken(Token *__return_storage_ptr__,
           Parser_Token_Server<std::_Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*>_>
           *this)

{
  bool bVar1;
  reference pTVar2;
  _Self local_88;
  variant local_58;
  Parser_Token_Server<std::_Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*>_>
  *local_18;
  Parser_Token_Server<std::_Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*>_>
  *this_local;
  
  local_18 = this;
  this_local = (Parser_Token_Server<std::_Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*>_>
                *)__return_storage_ptr__;
  bVar1 = std::operator==(&this->it,&this->end);
  if (bVar1) {
    util::variant::variant(&local_58);
    Token::Token(__return_storage_ptr__,Invalid,&local_58);
    util::variant::~variant(&local_58);
  }
  else {
    std::_Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*>::operator++
              (&local_88,&this->it,0);
    pTVar2 = std::_Deque_iterator<EOPlus::Token,_EOPlus::Token_&,_EOPlus::Token_*>::operator*
                       (&local_88);
    Token::Token(__return_storage_ptr__,pTVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Token xGetToken()
			{
				if (it == end)
					return Token();

				return *(it++);
			}